

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

uchar __thiscall RegVmLoweredFunction::GetRegisterForConstant(RegVmLoweredFunction *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar uVar3;
  
  uVar3 = GetRegister(this);
  uVar1 = (this->constantRegisters).count;
  if (uVar1 == (this->constantRegisters).max) {
    SmallArray<unsigned_char,_16U>::grow(&this->constantRegisters,uVar1);
  }
  puVar2 = (this->constantRegisters).data;
  if (puVar2 != (uchar *)0x0) {
    uVar1 = (this->constantRegisters).count;
    (this->constantRegisters).count = uVar1 + 1;
    puVar2[uVar1] = uVar3;
    return uVar3;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<unsigned char, 16>::push_back(const T &) [T = unsigned char, N = 16]"
               );
}

Assistant:

unsigned char RegVmLoweredFunction::GetRegisterForConstant()
{
	unsigned char result = GetRegister();

	constantRegisters.push_back(result);

	return result;
}